

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O3

int fe(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  long lVar14;
  
  lVar6 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x20);
  dVar2 = *(double *)((long)user_data + 0x28);
  dVar3 = *(double *)((long)user_data + 0x30);
  dVar4 = *(double *)((long)user_data + 8);
  uVar7 = N_VGetSubvector_ManyVector(y,0);
  lVar8 = N_VGetArrayPointer(uVar7);
  if (lVar8 == 0) {
    fe_cold_6();
  }
  else {
    uVar7 = N_VGetSubvector_ManyVector(y,1);
    lVar9 = N_VGetArrayPointer(uVar7);
    if (lVar9 == 0) {
      fe_cold_5();
    }
    else {
      uVar7 = N_VGetSubvector_ManyVector(y,2);
      lVar10 = N_VGetArrayPointer(uVar7);
      if (lVar10 == 0) {
        fe_cold_4();
      }
      else {
        uVar7 = N_VGetSubvector_ManyVector(ydot,0);
        puVar11 = (undefined8 *)N_VGetArrayPointer(uVar7);
        if (puVar11 == (undefined8 *)0x0) {
          fe_cold_3();
        }
        else {
          uVar7 = N_VGetSubvector_ManyVector(ydot,1);
          puVar12 = (undefined8 *)N_VGetArrayPointer(uVar7);
          if (puVar12 == (undefined8 *)0x0) {
            fe_cold_2();
          }
          else {
            uVar7 = N_VGetSubvector_ManyVector(ydot,2);
            puVar13 = (undefined8 *)N_VGetArrayPointer(uVar7);
            if (puVar13 != (undefined8 *)0x0) {
              N_VConst(0,ydot);
              if (2 < lVar6) {
                lVar14 = 0;
                do {
                  dVar5 = *(double *)(lVar8 + 8 + lVar14 * 8);
                  puVar11[lVar14 + 1] =
                       ((*(double *)(lVar8 + lVar14 * 8) - (dVar5 + dVar5)) +
                       *(double *)(lVar8 + 0x10 + lVar14 * 8)) * ((dVar1 / dVar4) / dVar4);
                  dVar5 = *(double *)(lVar9 + 8 + lVar14 * 8);
                  puVar12[lVar14 + 1] =
                       ((*(double *)(lVar9 + lVar14 * 8) - (dVar5 + dVar5)) +
                       *(double *)(lVar9 + 0x10 + lVar14 * 8)) * ((dVar2 / dVar4) / dVar4);
                  dVar5 = *(double *)(lVar10 + 8 + lVar14 * 8);
                  puVar13[lVar14 + 1] =
                       ((*(double *)(lVar10 + lVar14 * 8) - (dVar5 + dVar5)) +
                       *(double *)(lVar10 + 0x10 + lVar14 * 8)) * ((dVar3 / dVar4) / dVar4);
                  lVar14 = lVar14 + 1;
                } while (lVar6 + -2 != lVar14);
              }
              *puVar13 = 0;
              *puVar12 = 0;
              *puVar11 = 0;
              puVar13[lVar6 + -1] = 0;
              puVar12[lVar6 + -1] = 0;
              puVar11[lVar6 + -1] = 0;
              return 0;
            }
            fe_cold_1();
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static int fe(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData userdata = (UserData)user_data; /* access problem data */
  sunindextype N    = userdata->N;         /* set variable shortcuts */
  sunrealtype du    = userdata->du;
  sunrealtype dv    = userdata->dv;
  sunrealtype dw    = userdata->dw;
  sunrealtype dx    = userdata->dx;
  sunrealtype *y_u = NULL, *y_v = NULL, *y_w = NULL;
  sunrealtype *f_u = NULL, *f_v = NULL, *f_w = NULL;
  sunrealtype uconst, vconst, wconst;
  sunindextype i;

  y_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 0));
  if (check_flag((void*)y_u, "N_VGetArrayPointer", 0)) { return 1; }
  y_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 1));
  if (check_flag((void*)y_v, "N_VGetArrayPointer", 0)) { return 1; }
  y_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 2));
  if (check_flag((void*)y_w, "N_VGetArrayPointer", 0)) { return 1; }

  f_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 0));
  if (check_flag((void*)f_u, "N_VGetArrayPointer", 0)) { return 1; }
  f_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 1));
  if (check_flag((void*)f_v, "N_VGetArrayPointer", 0)) { return 1; }
  f_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 2));
  if (check_flag((void*)f_w, "N_VGetArrayPointer", 0)) { return 1; }

  N_VConst(SUN_RCONST(0.0), ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  uconst = du / dx / dx;
  vconst = dv / dx / dx;
  wconst = dw / dx / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* Fill in ODE RHS for u */
    f_u[i] = (y_u[i - 1] - TWO * y_u[i] + y_u[i + 1]) * uconst;

    /* Fill in ODE RHS for v */
    f_v[i] = (y_v[i - 1] - TWO * y_v[i] + y_v[i + 1]) * vconst;

    /* Fill in ODE RHS for w */
    f_w[i] = (y_w[i - 1] - TWO * y_w[i] + y_w[i + 1]) * wconst;
  }

  /* enforce stationary boundaries */
  f_u[0] = f_v[0] = f_w[0] = ZERO;
  f_u[N - 1] = f_v[N - 1] = f_w[N - 1] = ZERO;

  return 0; /* Return with success */
}